

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O3

void __thiscall minibag::Recorder::startWriting(Recorder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  CompressionType CVar2;
  String msg;
  BagException e;
  
  CVar2 = (CompressionType)&this->bag_;
  minibag::Bag::setCompression(CVar2);
  minibag::Bag::setChunkThreshold(CVar2);
  updateFilenames(this);
  minibag::Bag::open((string *)&this->bag_,(int)this + 0x3e0);
  if ((char)miniros::console::g_initialized == '\0') {
    miniros::console::initialize();
  }
  if (startWriting()::loc.initialized_ == false) {
    paVar1 = &msg.data.field_2;
    msg.data._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"miniros.unknown_package","");
    miniros::console::initializeLogLocation(&startWriting()::loc,(string *)&msg,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg.data._M_dataplus._M_p != paVar1) {
      operator_delete(msg.data._M_dataplus._M_p,
                      CONCAT71(msg.data.field_2._M_allocated_capacity._1_7_,
                               msg.data.field_2._M_local_buf[0]) + 1);
    }
  }
  if (startWriting()::loc.level_ != Info) {
    startWriting();
  }
  if (startWriting()::loc.logger_enabled_ == true) {
    startWriting(this);
  }
  if ((this->options_).publish == true) {
    paVar1 = &msg.data.field_2;
    msg.data._M_string_length = 0;
    msg.data.field_2._M_local_buf[0] = '\0';
    __s = (this->target_filename_)._M_dataplus._M_p;
    msg.data._M_dataplus._M_p = (pointer)paVar1;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&msg,0,(char *)0x0,(ulong)__s);
    miniros::Publisher::publish<std_msgs::String_<std::allocator<void>>>
              (&this->pub_begin_write,&msg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg.data._M_dataplus._M_p != paVar1) {
      operator_delete(msg.data._M_dataplus._M_p,
                      CONCAT71(msg.data.field_2._M_allocated_capacity._1_7_,
                               msg.data.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void Recorder::startWriting()
{
  bag_.setCompression(options_.compression);
  bag_.setChunkThreshold(options_.chunk_size);

  updateFilenames();
  try {
    bag_.open(write_filename_, bagmode::Write);
  } catch (minibag::BagException e) {
    MINIROS_ERROR("Error writing: %s", e.what());
    exit_code_ = 1;
    miniros::shutdown();
  }
  MINIROS_INFO("Recording to %s.", target_filename_.c_str());

  if (options_.publish) {
    std_msgs::String msg;
    msg.data = target_filename_.c_str();
    pub_begin_write.publish(msg);
  }
}